

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test::TestBody
          (UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test *this)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  T *sigmaMeasurementPoints;
  undefined1 local_1e0 [8];
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  template_SigmaPoints<Vector<T,_2>_> points;
  undefined1 auStack_d8 [4];
  undefined1 auStack_d4 [4];
  Matrix<T,_2,_7> ref;
  Scalar local_98;
  Scalar local_94;
  Scalar local_90;
  Scalar local_8c;
  Scalar local_88;
  Scalar local_84;
  Scalar local_80;
  Scalar local_7c;
  Scalar local_78;
  Scalar local_74;
  Scalar local_70;
  Scalar local_6c;
  Scalar local_68;
  Scalar local_64;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *local_60;
  uint local_54;
  Scalar local_50 [2];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_1e0);
  local_1e0._0_4_ = 0.0;
  local_1e0._4_4_ = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array._48_8_ =
       &PTR_h_00184ba8;
  _auStack_d8 = (float *)((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                 sigmaWeights_c.super_Matrix<float,_7,_1>.
                                 super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                 m_storage.m_data + 0x14);
  local_60 = (CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)auStack_d8;
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0] = 0.0;
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1] = 0.0;
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3] = 0.0;
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (local_60,&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                lambda);
  local_50[0] = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar2,local_50)
  ;
  local_38.ptr_._0_4_ = 0x40800000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,(Scalar *)&local_38);
  gtest_ar.message_.ptr_._0_4_ = 0x40a00000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,(Scalar *)&gtest_ar.message_);
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xc] = 6.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                             m_storage.m_data.array + 0xc);
  ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xd] = 7.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                             m_storage.m_data.array + 0xd);
  local_98 = 8.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_98);
  local_94 = 9.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_94);
  local_90 = 10.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_90);
  local_8c = 11.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_8c);
  local_88 = 12.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_88);
  local_84 = 13.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_84);
  local_80 = 14.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_80);
  local_7c = 15.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_7c);
  local_78 = 16.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_78);
  local_74 = 17.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_74);
  local_70 = 18.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_70);
  local_6c = 19.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_6c);
  local_68 = 20.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar2,&local_68);
  local_64 = 21.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar2,&local_64);
  if ((ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array._16_8_
       + ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array.
         _0_8_ == 3) &&
     (ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array._8_8_
      == 7)) {
    _auStack_d8 = (float *)CONCAT44(ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                    sigmaWeights_c.super_Matrix<float,_7,_1>.
                                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                    m_storage.m_data.array[6] *
                                    ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                    sigmaWeights_c.super_Matrix<float,_7,_1>.
                                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                    m_storage.m_data.array[6],
                                    ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                    sigmaWeights_c.super_Matrix<float,_7,_1>.
                                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                    m_storage.m_data.array[5] *
                                    ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                    sigmaWeights_c.super_Matrix<float,_7,_1>.
                                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                    m_storage.m_data.array[5]);
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[2] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[2];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[1] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[1];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[5] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[5];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[4] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[4];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[8] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[8];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[7] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[7];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[6] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[10] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[10];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[7] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0xb] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0xb];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[8] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0xd] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0xd];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[9] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0xe] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0xe];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[10] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x10] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x10];
    ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xb] =
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x11] *
         ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x11];
    sigmaMeasurementPoints = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda;
    Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::
    computeSigmaPointMeasurements<Kalman::Vector<float,_2>,_Kalman::StandardBase>
              ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_1e0,
               (MeasurementModelType<Kalman::Vector<float,_2>,_Kalman::StandardBase> *)
               (points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
                array + 0xc),(SigmaPoints<Kalman::Vector<float,_2>_> *)sigmaMeasurementPoints);
    local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)local_50,"ref.rows()","points.rows()",(long *)&local_38,
               (long *)&gtest_ar.message_);
    if (local_50[0]._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x61,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (((local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000007;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000007;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_50,"ref.cols()","points.cols()",(long *)&local_38,
                 (long *)&gtest_ar.message_);
      if (local_50[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x61,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (((local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar3 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        do {
          local_54 = (uint)uVar3;
          lVar5 = 0;
          do {
            testing::internal::DoubleNearPredFormat
                      ((internal *)local_50,"ref(i,j)","points(i,j)","1e-10",
                       (double)*(float *)(&local_60->m_xpr + lVar5),
                       (double)sigmaMeasurementPoints[lVar5 * 2],1e-10);
            if (local_50[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_38);
              if (gtest_ar._0_8_ == 0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                         ,0x61,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
              if (((local_38.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
                 (local_38.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_38.ptr_ + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              return;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 7);
          sigmaMeasurementPoints = (T *)&stack0xfffffffffffffed4;
          local_60 = (CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)(auStack_d8 + 4);
          uVar3 = 0;
        } while ((local_54 & 1) != 0);
      }
    }
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 7>>::finished() [MatrixType = Eigen::Matrix<float, 3, 7>]"
               );
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaPointMeasurements) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    auto model = Kalman::Test::Models::QuadraticMeasurementModel<Vector<T, 3>, Vector<T, 2>>();
    
    // Init variables
    ukf.sigmaStatePoints <<
         1,  2,  3,  4,  5,  6,  7,
         8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21;
    
    // Compute Reference result
    Matrix<T,2,7> tmp = ukf.sigmaStatePoints.template topRows<2>();
    Matrix<T,2,7> ref = tmp.cwiseProduct(tmp).eval();
    
    typename ConcreteUKF<Vector<T,3>>::template SigmaPoints<Vector<T,2>> points;
    
    ukf.computeSigmaPointMeasurements(model, points);
    
    // Compare ref and result
    ASSERT_MATRIX_NEAR(ref, points, 1e-10);
}